

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IniTest.cpp
# Opt level: O0

void __thiscall
TApp_IniNotRequiredNotDefault_Test::TestBody(TApp_IniNotRequiredNotDefault_Test *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  string *psVar2;
  ostream *poVar3;
  char *pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_828;
  AssertHelper local_720;
  Message local_718;
  int local_70c;
  undefined1 local_708 [8];
  AssertionResult gtest_ar_3;
  Message local_6f0;
  int local_6e4;
  undefined1 local_6e0 [8];
  AssertionResult gtest_ar_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6c0;
  string local_6a0 [32];
  iterator local_680;
  size_type local_678;
  AssertHelper local_670;
  Message local_668;
  int local_65c;
  undefined1 local_658 [8];
  AssertionResult gtest_ar_1;
  Message local_640;
  int local_634;
  undefined1 local_630 [8];
  AssertionResult gtest_ar;
  string local_618;
  allocator local_5f1;
  string local_5f0;
  allocator local_5c9;
  string local_5c8;
  allocator local_5a1;
  string local_5a0;
  allocator local_579;
  string local_578;
  allocator local_551;
  string local_550;
  int local_52c [2];
  int three;
  int two;
  int one;
  ofstream out_1;
  ostream local_320 [8];
  ofstream out;
  allocator local_119;
  string local_118;
  string local_f8;
  allocator local_d1;
  string local_d0;
  allocator local_a9;
  string local_a8;
  undefined1 local_88 [8];
  TempFile tmpini2;
  allocator local_51;
  string local_50;
  undefined1 local_30 [8];
  TempFile tmpini;
  TApp_IniNotRequiredNotDefault_Test *this_local;
  
  tmpini._name.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"TestIniTmp.ini",&local_51);
  TempFile::TempFile((TempFile *)local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a8,"TestIniTmp2.ini",&local_a9);
  TempFile::TempFile((TempFile *)local_88,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d0,"--config",&local_d1);
  psVar2 = TempFile::operator_cast_to_string_((TempFile *)local_30);
  std::__cxx11::string::string((string *)&local_f8,(string *)psVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_118,"Read an ini file",&local_119);
  CLI::App::set_config(&(this->super_TApp).app,&local_d0,&local_f8,&local_118,false);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  psVar2 = TempFile::operator_cast_to_string_((TempFile *)local_30);
  std::ofstream::ofstream(local_320,psVar2,0x10);
  poVar3 = std::operator<<(local_320,"[default]");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(local_320,"two=99");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(local_320,"three=3");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::ofstream::~ofstream(local_320);
  psVar2 = TempFile::operator_cast_to_string_((TempFile *)local_88);
  std::ofstream::ofstream(&two,psVar2,0x10);
  poVar3 = std::operator<<((ostream *)&two,"[default]");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&two,"two=98");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&two,"three=4");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::ofstream::~ofstream(&two);
  three = 0;
  local_52c[1] = 0;
  local_52c[0] = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_550,"--one",&local_551);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_578,"",&local_579);
  CLI::App::add_option<int,_(CLI::detail::enabler)0>
            (&(this->super_TApp).app,&local_550,&three,&local_578);
  std::__cxx11::string::~string((string *)&local_578);
  std::allocator<char>::~allocator((allocator<char> *)&local_579);
  std::__cxx11::string::~string((string *)&local_550);
  std::allocator<char>::~allocator((allocator<char> *)&local_551);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5a0,"--two",&local_5a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5c8,"",&local_5c9);
  CLI::App::add_option<int,_(CLI::detail::enabler)0>
            (&(this->super_TApp).app,&local_5a0,local_52c + 1,&local_5c8);
  std::__cxx11::string::~string((string *)&local_5c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5c9);
  std::__cxx11::string::~string((string *)&local_5a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5f0,"--three",&local_5f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_618,"",(allocator *)((long)&gtest_ar.message_.ptr_ + 7));
  CLI::App::add_option<int,_(CLI::detail::enabler)0>
            (&(this->super_TApp).app,&local_5f0,local_52c,&local_618);
  std::__cxx11::string::~string((string *)&local_618);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  std::__cxx11::string::~string((string *)&local_5f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5f1);
  TApp::run(&this->super_TApp);
  local_634 = 99;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_630,"99","two",&local_634,local_52c + 1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_630);
  if (!bVar1) {
    testing::Message::Message(&local_640);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_630);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
               ,0xe2,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_640);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_640);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_630);
  local_65c = 3;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_658,"3","three",&local_65c,local_52c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_658);
  if (!bVar1) {
    testing::Message::Message(&local_668);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_658);
    testing::internal::AssertHelper::AssertHelper
              (&local_670,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
               ,0xe3,pcVar4);
    testing::internal::AssertHelper::operator=(&local_670,&local_668);
    testing::internal::AssertHelper::~AssertHelper(&local_670);
    testing::Message::~Message(&local_668);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_658);
  CLI::App::reset(&(this->super_TApp).app);
  gtest_ar_2.message_.ptr_._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_6c0,"--config",(allocator *)((long)&gtest_ar_2.message_.ptr_ + 7));
  psVar2 = TempFile::operator_cast_to_string_((TempFile *)local_88);
  std::__cxx11::string::string(local_6a0,(string *)psVar2);
  gtest_ar_2.message_.ptr_._6_1_ = 0;
  local_680 = &local_6c0;
  local_678 = 2;
  __l._M_len = 2;
  __l._M_array = local_680;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l);
  local_828 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_680;
  do {
    local_828 = local_828 + -1;
    std::__cxx11::string::~string((string *)local_828);
  } while (local_828 != &local_6c0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_2.message_.ptr_ + 7));
  TApp::run(&this->super_TApp);
  local_6e4 = 0x62;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_6e0,"98","two",&local_6e4,local_52c + 1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6e0);
  if (!bVar1) {
    testing::Message::Message(&local_6f0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_6e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
               ,0xe9,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_6f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_6f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6e0);
  local_70c = 4;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_708,"4","three",&local_70c,local_52c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_708);
  if (!bVar1) {
    testing::Message::Message(&local_718);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_708);
    testing::internal::AssertHelper::AssertHelper
              (&local_720,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
               ,0xea,pcVar4);
    testing::internal::AssertHelper::operator=(&local_720,&local_718);
    testing::internal::AssertHelper::~AssertHelper(&local_720);
    testing::Message::~Message(&local_718);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_708);
  TempFile::~TempFile((TempFile *)local_88);
  TempFile::~TempFile((TempFile *)local_30);
  return;
}

Assistant:

TEST_F(TApp, IniNotRequiredNotDefault) {

    TempFile tmpini{"TestIniTmp.ini"};
    TempFile tmpini2{"TestIniTmp2.ini"};

    app.set_config("--config", tmpini);

    {
        std::ofstream out{tmpini};
        out << "[default]" << std::endl;
        out << "two=99" << std::endl;
        out << "three=3" << std::endl;
    }

    {
        std::ofstream out{tmpini2};
        out << "[default]" << std::endl;
        out << "two=98" << std::endl;
        out << "three=4" << std::endl;
    }

    int one = 0, two = 0, three = 0;
    app.add_option("--one", one);
    app.add_option("--two", two);
    app.add_option("--three", three);

    run();

    EXPECT_EQ(99, two);
    EXPECT_EQ(3, three);

    app.reset();
    args = {"--config", tmpini2};
    run();

    EXPECT_EQ(98, two);
    EXPECT_EQ(4, three);
}